

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall gl4cts::ShaderSubroutine::FunctionalTest12::testSSBO(FunctionalTest12 *this)

{
  bool bVar1;
  bool bVar2;
  GLuint subroutine_index;
  GLuint subroutine_index_00;
  socklen_t sVar3;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar4;
  framebuffer framebuffer;
  buffer buffer;
  vertexArray vao;
  texture color_texture;
  program program;
  
  framebuffer.m_context = (this->super_TestCase).m_context;
  buffer.m_id = 0;
  color_texture.m_id = 0;
  framebuffer.m_id = 0;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  vao.m_id = 0;
  sVar3 = 0x16b46b9;
  iVar4 = 0;
  buffer.m_context = framebuffer.m_context;
  vao.m_context = framebuffer.m_context;
  color_texture.m_context = framebuffer.m_context;
  program.m_context = framebuffer.m_context;
  Utils::program::build
            (&program,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_storage_buffer_object : require\n#extension GL_ARB_shader_subroutine            : require\n\nprecision highp float;\n\nlayout(location = 0) out uvec4 out_color;\n\nlayout(std140, binding = 0) buffer Buffer\n{\n    uvec4 entry;\n};\n\nsubroutine void ssbo_routine(void)\n;\nsubroutine(ssbo_routine) void increment(void)\n{\n    out_color.x = atomicAdd(entry.x, 1);\n    out_color.y = atomicAdd(entry.y, 1);\n    out_color.z = atomicAdd(entry.z, 1);\n    out_color.w = atomicAdd(entry.w, 1);\n}\n\nsubroutine(ssbo_routine) void decrement(void)\n{\n    out_color.x = atomicAdd(entry.x, -1);\n    out_color.y = atomicAdd(entry.y, -1);\n    out_color.z = atomicAdd(entry.z, -1);\n    out_color.w = atomicAdd(entry.w, -1);\n}\n\nsubroutine uniform ssbo_routine routine;\n\nvoid main()\n{\n    routine();\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    gl_Position = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4(-1,  1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1,  1, 0, 1);\n    EmitVertex();\n    \n    EndPrimitive();\n}\n\n"
             ,(GLchar *)0x0,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
             ,(GLchar **)0x0,0,false);
  Utils::program::use(&program);
  Utils::vertexArray::generate(&vao);
  Utils::vertexArray::bind(&vao,iVar4,__addr,sVar3);
  Utils::texture::create(&color_texture,0x10,0x10,0x8d70);
  Utils::buffer::generate(&buffer);
  Utils::buffer::update(&buffer,0x90d2,0x10,testSSBO::buffer_data,0x88e4);
  iVar4 = 0x90d2;
  sVar3 = 0;
  Utils::buffer::bindRange(&buffer,0x90d2,0,0,0x10);
  Utils::framebuffer::generate(&framebuffer);
  Utils::framebuffer::bind(&framebuffer,iVar4,__addr_00,sVar3);
  Utils::framebuffer::attachTexture(&framebuffer,0x8ce0,color_texture.m_id,0x10,0x10);
  Utils::framebuffer::clearColor(&framebuffer,0.0,0.0,0.0,0.0);
  Utils::framebuffer::clear(&framebuffer,0x4000);
  subroutine_index = Utils::program::getSubroutineIndex(&program,"increment",0x8b30);
  subroutine_index_00 = Utils::program::getSubroutineIndex(&program,"decrement",0x8b30);
  bVar1 = testSSBODraw(this,subroutine_index,testSSBO::expected_incremented);
  bVar2 = testSSBODraw(this,subroutine_index_00,testSSBO::expected_decremented);
  Utils::vertexArray::~vertexArray(&vao);
  Utils::program::~program(&program);
  Utils::framebuffer::~framebuffer(&framebuffer);
  Utils::texture::~texture(&color_texture);
  Utils::buffer::~buffer(&buffer);
  return bVar1 && bVar2;
}

Assistant:

bool FunctionalTest12::testSSBO()
{
	static const GLchar* fragment_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_storage_buffer_object : require\n"
												"#extension GL_ARB_shader_subroutine            : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(location = 0) out uvec4 out_color;\n"
												"\n"
												"layout(std140, binding = 0) buffer Buffer\n"
												"{\n"
												"    uvec4 entry;\n"
												"};\n"
												"\n"
												"subroutine void ssbo_routine(void)\n;"
												"\n"
												"subroutine(ssbo_routine) void increment(void)\n"
												"{\n"
												"    out_color.x = atomicAdd(entry.x, 1);\n"
												"    out_color.y = atomicAdd(entry.y, 1);\n"
												"    out_color.z = atomicAdd(entry.z, 1);\n"
												"    out_color.w = atomicAdd(entry.w, 1);\n"
												"}\n"
												"\n"
												"subroutine(ssbo_routine) void decrement(void)\n"
												"{\n"
												"    out_color.x = atomicAdd(entry.x, -1);\n"
												"    out_color.y = atomicAdd(entry.y, -1);\n"
												"    out_color.z = atomicAdd(entry.z, -1);\n"
												"    out_color.w = atomicAdd(entry.w, -1);\n"
												"}\n"
												"\n"
												"subroutine uniform ssbo_routine routine;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    routine();\n"
												"}\n"
												"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = { "increment", "decrement" };

	/* Test data */
	static const glw::GLuint buffer_data[] = { m_texture_width * m_texture_height + 1,
											   m_texture_width * m_texture_height + 2,
											   m_texture_width * m_texture_height + 3,
											   m_texture_width * m_texture_height + 4 };

	static const glw::GLuint expected_incremented[] = { m_texture_width * m_texture_height + buffer_data[0],
														m_texture_width * m_texture_height + buffer_data[1],
														m_texture_width * m_texture_height + buffer_data[2],
														m_texture_width * m_texture_height + buffer_data[3] };

	static const glw::GLuint expected_decremented[] = { buffer_data[0], buffer_data[1], buffer_data[2],
														buffer_data[3] };

	/* GL objects */
	Utils::buffer	  buffer(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	color_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);

	buffer.generate();
	buffer.update(GL_SHADER_STORAGE_BUFFER, sizeof(buffer_data), (GLvoid*)buffer_data, GL_STATIC_DRAW);
	buffer.bindRange(GL_SHADER_STORAGE_BUFFER, 0 /* index */, 0 /* offset */, sizeof(buffer_data));

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);
	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	framebuffer.clear(GL_COLOR_BUFFER_BIT);

	/* Subroutine indices */
	GLuint increment = program.getSubroutineIndex(subroutine_names[0], GL_FRAGMENT_SHADER);
	GLuint decrement = program.getSubroutineIndex(subroutine_names[1], GL_FRAGMENT_SHADER);

	/* Test */
	bool result = true;

	if (false == testSSBODraw(increment, expected_incremented))
	{
		result = false;
	}

	if (false == testSSBODraw(decrement, expected_decremented))
	{
		result = false;
	}

	/* Done */
	return result;
}